

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::filterTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__
                  ,vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  bool bVar1;
  size_type __n;
  reference testCase_00;
  TestCase *testCase;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  IConfig *config_local;
  TestSpec *testSpec_local;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases_local;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *filtered;
  
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            (__return_storage_ptr__);
  __n = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(testCases);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
            (__return_storage_ptr__,__n);
  __end1 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(testCases);
  testCase = (TestCase *)
             clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(testCases);
  while (bVar1 = __gnu_cxx::
                 operator==<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                           (&__end1,(__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                     *)&testCase), ((bVar1 ^ 0xffU) & 1) != 0) {
    testCase_00 = __gnu_cxx::
                  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  ::operator*(&__end1);
    bVar1 = TestSpec::hasFilters(testSpec);
    if (((!bVar1) && (bVar1 = TestCaseInfo::isHidden(&testCase_00->super_TestCaseInfo), !bVar1)) ||
       ((bVar1 = TestSpec::hasFilters(testSpec), bVar1 &&
        (bVar1 = matchTest(testCase_00,testSpec,config), bVar1)))) {
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (__return_storage_ptr__,testCase_00);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCase> filterTests( std::vector<TestCase> const& testCases, TestSpec const& testSpec, IConfig const& config ) {
        std::vector<TestCase> filtered;
        filtered.reserve( testCases.size() );
        for (auto const& testCase : testCases) {
            if ((!testSpec.hasFilters() && !testCase.isHidden()) ||
                (testSpec.hasFilters() && matchTest(testCase, testSpec, config))) {
                filtered.push_back(testCase);
            }
        }
        return filtered;
    }